

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCopiesAndBlittingTests.cpp
# Opt level: O0

bool __thiscall
vkt::api::anon_unknown_0::CompareEachPixelInEachRegion::forEach
          (CompareEachPixelInEachRegion *this,void *pUserData,
          vector<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
          *regions,int sourceWidth,int sourceHeight,PixelBufferAccess *errorMask)

{
  VkImageAspectFlags VVar1;
  int iVar2;
  int iVar3;
  deUint32 dVar4;
  deUint32 dVar5;
  int iVar6;
  int iVar7;
  deUint32 dVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  pointer pCVar13;
  Vector<float,_4> local_88;
  Vector<float,_2> local_78;
  Vec2 srcNormCoord;
  int x;
  int y;
  float srcInvH;
  float srcInvW;
  float yScale;
  float xScale;
  int dy;
  int dx;
  VkImageBlit *blit;
  __normal_iterator<const_vkt::api::(anonymous_namespace)::CopyRegion_*,_std::vector<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>_>
  local_40;
  const_iterator regionIter;
  bool compareOk;
  PixelBufferAccess *errorMask_local;
  int sourceHeight_local;
  int sourceWidth_local;
  vector<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
  *regions_local;
  void *pUserData_local;
  CompareEachPixelInEachRegion *this_local;
  
  regionIter._M_current._7_1_ = 1;
  local_40._M_current =
       (CopyRegion *)
       std::
       vector<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
       ::begin(regions);
  while( true ) {
    blit = (VkImageBlit *)
           std::
           vector<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
           ::end(regions);
    bVar9 = __gnu_cxx::operator!=
                      (&local_40,
                       (__normal_iterator<const_vkt::api::(anonymous_namespace)::CopyRegion_*,_std::vector<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>_>
                        *)&blit);
    if (!bVar9) break;
    pCVar13 = __gnu_cxx::
              __normal_iterator<const_vkt::api::(anonymous_namespace)::CopyRegion_*,_std::vector<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>_>
              ::operator->(&local_40);
    iVar10 = deSign32((pCVar13->imageBlit).dstOffsets[1].x - (pCVar13->imageCopy).extent.width);
    iVar11 = deSign32((pCVar13->imageBlit).dstOffsets[1].y - (pCVar13->imageCopy).extent.height);
    VVar1 = (pCVar13->imageCopy).dstSubresource.aspectMask;
    iVar2 = (pCVar13->imageCopy).srcOffset.x;
    iVar3 = (pCVar13->imageBlit).dstOffsets[1].x;
    dVar4 = (pCVar13->imageCopy).extent.width;
    dVar5 = (pCVar13->imageCopy).dstSubresource.mipLevel;
    iVar6 = (pCVar13->imageCopy).srcOffset.y;
    iVar7 = (pCVar13->imageBlit).dstOffsets[1].y;
    dVar8 = (pCVar13->imageCopy).extent.height;
    for (srcNormCoord.m_data[1] = (float)(pCVar13->imageCopy).extent.height;
        (int)srcNormCoord.m_data[1] < (pCVar13->imageBlit).dstOffsets[1].y;
        srcNormCoord.m_data[1] = (float)(iVar11 + (int)srcNormCoord.m_data[1])) {
      for (srcNormCoord.m_data[0] = (float)(pCVar13->imageCopy).extent.width;
          (int)srcNormCoord.m_data[0] < (pCVar13->imageBlit).dstOffsets[1].x;
          srcNormCoord.m_data[0] = (float)(iVar10 + (int)srcNormCoord.m_data[0])) {
        tcu::Vector<float,_2>::Vector
                  (&local_78,
                   (((float)(int)(VVar1 - iVar2) / (float)(int)(iVar3 - dVar4)) *
                    ((float)(int)((int)srcNormCoord.m_data[0] - (pCVar13->imageCopy).extent.width) +
                    0.5) + (float)(pCVar13->imageCopy).srcOffset.x) * (1.0 / (float)sourceWidth),
                   (((float)(int)(dVar5 - iVar6) / (float)(int)(iVar7 - dVar8)) *
                    ((float)(int)((int)srcNormCoord.m_data[1] - (pCVar13->imageCopy).extent.height)
                    + 0.5) + (float)(pCVar13->imageCopy).srcOffset.y) * (1.0 / (float)sourceHeight))
        ;
        uVar12 = (*this->_vptr_CompareEachPixelInEachRegion[2])
                           (this,pUserData,(ulong)(uint)srcNormCoord.m_data[0],
                            (ulong)(uint)srcNormCoord.m_data[1]);
        if ((uVar12 & 1) == 0) {
          tcu::Vector<float,_4>::Vector(&local_88,1.0,0.0,0.0,1.0);
          tcu::PixelBufferAccess::setPixel
                    (errorMask,&local_88,(int)srcNormCoord.m_data[0],(int)srcNormCoord.m_data[1],0);
          regionIter._M_current._7_1_ = 0;
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_vkt::api::(anonymous_namespace)::CopyRegion_*,_std::vector<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>_>
    ::operator++(&local_40);
  }
  return (bool)(regionIter._M_current._7_1_ & 1);
}

Assistant:

bool forEach (const void*						pUserData,
				  const std::vector<CopyRegion>&	regions,
				  const int							sourceWidth,
				  const int							sourceHeight,
				  const tcu::PixelBufferAccess&		errorMask) const
	{
		bool compareOk = true;

		for (std::vector<CopyRegion>::const_iterator regionIter = regions.begin(); regionIter != regions.end(); ++regionIter)
		{
			const VkImageBlit& blit = regionIter->imageBlit;

			const int	dx		= deSign32(blit.dstOffsets[1].x - blit.dstOffsets[0].x);
			const int	dy		= deSign32(blit.dstOffsets[1].y - blit.dstOffsets[0].y);
			const float	xScale	= static_cast<float>(blit.srcOffsets[1].x - blit.srcOffsets[0].x) / static_cast<float>(blit.dstOffsets[1].x - blit.dstOffsets[0].x);
			const float	yScale	= static_cast<float>(blit.srcOffsets[1].y - blit.srcOffsets[0].y) / static_cast<float>(blit.dstOffsets[1].y - blit.dstOffsets[0].y);
			const float srcInvW	= 1.0f / static_cast<float>(sourceWidth);
			const float srcInvH	= 1.0f / static_cast<float>(sourceHeight);

			for (int y = blit.dstOffsets[0].y; y < blit.dstOffsets[1].y; y += dy)
			for (int x = blit.dstOffsets[0].x; x < blit.dstOffsets[1].x; x += dx)
			{
				const tcu::Vec2 srcNormCoord
				(
					(xScale * (static_cast<float>(x - blit.dstOffsets[0].x) + 0.5f) + static_cast<float>(blit.srcOffsets[0].x)) * srcInvW,
					(yScale * (static_cast<float>(y - blit.dstOffsets[0].y) + 0.5f) + static_cast<float>(blit.srcOffsets[0].y)) * srcInvH
				);

				if (!compare(pUserData, x, y, srcNormCoord))
				{
					errorMask.setPixel(tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f), x, y);
					compareOk = false;
				}
			}
		}
		return compareOk;
	}